

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O3

debugger_type * __thiscall
type_safe::basic_optional<type_safe::reference_optional_storage<debugger_type,_true>_>::value
          (basic_optional<type_safe::reference_optional_storage<debugger_type,_true>_> *this)

{
  debugger_type *pdVar1;
  source_location local_10;
  
  local_10.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/include/type_safe/optional.hpp"
  ;
  local_10.line_number = 0x1b0;
  pdVar1 = (this->
           super_optional_storage<type_safe::reference_optional_storage<debugger_type,_true>_>).
           storage.pointer_;
  if (pdVar1 != (debugger_type *)0x0) {
    return pdVar1;
  }
  debug_assert::default_handler::handle(&local_10,"has_value()",(char *)0x0);
  abort();
}

Assistant:

auto value() const TYPE_SAFE_LVALUE_REF noexcept
        -> decltype(std::declval<const storage&>().get_value())
    {
        DEBUG_ASSERT(has_value(), detail::precondition_error_handler{});
        return get_storage().get_value();
    }